

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O3

void __thiscall
TEST_MockReturnValueTest_WhenAUnsignedIntegerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
::testBody(TEST_MockReturnValueTest_WhenAUnsignedIntegerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
           *this)

{
  int iVar1;
  uint uVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  UtestShell *pUVar4;
  undefined4 extraout_var_00;
  TestTerminator *pTVar5;
  SimpleString local_38;
  SimpleString local_28;
  
  SimpleString::SimpleString(&local_38,"");
  pMVar3 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_28);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xd0))
            ((long *)CONCAT44(extraout_var,iVar1),0xb);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_38);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_38,"");
  pMVar3 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_28);
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x118))
                    ((long *)CONCAT44(extraout_var_00,iVar1),10);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,0xb,(ulong)uVar2,
             "LONGS_EQUAL(expected_return_value, mock().actualCall(\"foo\").returnUnsignedIntValueOrDefault(default_return_value)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xf1,pTVar5);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_38);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_38,"");
  pMVar3 = mock(&local_38,(MockFailureReporter *)0x0);
  uVar2 = (*pMVar3->_vptr_MockSupport[0x16])(pMVar3,10);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,0xb,(ulong)uVar2,
             "LONGS_EQUAL(expected_return_value, mock().returnUnsignedIntValueOrDefault(default_return_value)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xf2,pTVar5);
  SimpleString::~SimpleString(&local_38);
  return;
}

Assistant:

TEST(MockReturnValueTest, WhenAUnsignedIntegerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault)
{
    unsigned int default_return_value = 10;
    unsigned int expected_return_value = default_return_value + 1;
    mock().expectOneCall("foo").andReturnValue(expected_return_value);
    LONGS_EQUAL(expected_return_value, mock().actualCall("foo").returnUnsignedIntValueOrDefault(default_return_value));
    LONGS_EQUAL(expected_return_value, mock().returnUnsignedIntValueOrDefault(default_return_value));
}